

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

QWidget * QApplication::activeModalWidget(void)

{
  QWidgetWindow *pQVar1;
  QWidgetWindow *widgetWindow;
  undefined8 local_10;
  
  QGuiApplication::modalWindow();
  pQVar1 = qobject_cast<QWidgetWindow*>((QObject *)0x2ca4c5);
  if (pQVar1 == (QWidgetWindow *)0x0) {
    local_10 = (QWidget *)0x0;
  }
  else {
    local_10 = QWidgetWindow::widget((QWidgetWindow *)0x2ca4dc);
  }
  return local_10;
}

Assistant:

QWidget *QApplication::activeModalWidget()
{
    QWidgetWindow *widgetWindow = qobject_cast<QWidgetWindow *>(modalWindow());
    return widgetWindow ? widgetWindow->widget() : nullptr;
}